

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb__alloc * stb__get_context(void *context)

{
  stb__alloc_type sVar1;
  stb__chunked *s;
  int u;
  void *context_local;
  
  if (context == (void *)0x0) {
    context_local = &stb__alloc_global;
  }
  else {
    sVar1 = stb__identify(context);
    if (sVar1 == STB__chunked) {
      context_local = (void *)(*(long *)((long)context + -8) + -1);
    }
    else {
      context_local = (void *)((long)context + -0x20);
    }
  }
  return (stb__alloc *)context_local;
}

Assistant:

static stb__alloc * stb__get_context(void *context)
{
   if (context == NULL) {
      return &stb__alloc_global;
   } else {
      int u = stb__identify(context);
      // if context is chunked, grab parent
      if (u == STB__chunked) {
         stb__chunked *s = (stb__chunked *) context - 1;
         return stb__parent(s);
      } else {
         return (stb__alloc *) context - 1;
      }
   }
}